

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O1

IColourImpl * Catch::Colour::impl(void)

{
  int iVar1;
  undefined **ppuVar2;
  undefined1 *puVar3;
  
  iVar1 = isatty(1);
  if (iVar1 == 0) {
    if ((anonymous_namespace)::NoColourImpl::instance()::s_instance != '\0') {
      return (IColourImpl *)&(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    }
    puVar3 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::NoColourImpl::instance()::s_instance);
    ppuVar2 = &(anonymous_namespace)::NoColourImpl::instance()::s_instance;
  }
  else {
    if ((anonymous_namespace)::platformColourInstance()::s_instance != '\0') {
      return (IColourImpl *)&(anonymous_namespace)::platformColourInstance()::s_instance;
    }
    puVar3 = &(anonymous_namespace)::platformColourInstance()::s_instance;
    iVar1 = __cxa_guard_acquire(&(anonymous_namespace)::platformColourInstance()::s_instance);
    ppuVar2 = (undefined **)&(anonymous_namespace)::platformColourInstance()::s_instance;
  }
  if (iVar1 != 0) {
    __cxa_guard_release(puVar3);
  }
  return (IColourImpl *)ppuVar2;
}

Assistant:

inline bool shouldUseColourForPlatform() {
        return isatty(STDOUT_FILENO);
    }